

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radix_partitioning.cpp
# Opt level: O1

void __thiscall duckdb::RadixPartitionedTupleData::Initialize(RadixPartitionedTupleData *this)

{
  TupleDataCollection *pTVar1;
  pointer this_00;
  ulong uVar2;
  ulong uVar3;
  TupleDataCollection *local_40;
  idx_t local_38;
  
  local_38 = this->radix_bits;
  uVar3 = 1;
  do {
    PartitionedTupleData::CreatePartitionCollection
              ((PartitionedTupleData *)&stack0xffffffffffffffc0,(idx_t)this);
    ::std::
    vector<duckdb::unique_ptr<duckdb::TupleDataCollection,std::default_delete<duckdb::TupleDataCollection>,true>,std::allocator<duckdb::unique_ptr<duckdb::TupleDataCollection,std::default_delete<duckdb::TupleDataCollection>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::TupleDataCollection,std::default_delete<duckdb::TupleDataCollection>,true>>
              ((vector<duckdb::unique_ptr<duckdb::TupleDataCollection,std::default_delete<duckdb::TupleDataCollection>,true>,std::allocator<duckdb::unique_ptr<duckdb::TupleDataCollection,std::default_delete<duckdb::TupleDataCollection>,true>>>
                *)&(this->super_PartitionedTupleData).partitions,
               (unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>
                *)&stack0xffffffffffffffc0);
    pTVar1 = local_40;
    if (local_40 != (TupleDataCollection *)0x0) {
      TupleDataCollection::~TupleDataCollection(local_40);
      operator_delete(pTVar1);
    }
    this_00 = unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>
              ::operator->((this->super_PartitionedTupleData).partitions.
                           super_vector<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>_>_>
                           .
                           super__Vector_base<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish + -1);
    TupleDataCollection::SetPartitionIndex(this_00,uVar3 - 1);
    uVar2 = uVar3 >> ((byte)local_38 & 0x3f);
    uVar3 = uVar3 + 1;
  } while (uVar2 == 0);
  return;
}

Assistant:

void RadixPartitionedTupleData::Initialize() {
	const auto num_partitions = RadixPartitioning::NumberOfPartitions(radix_bits);
	for (idx_t i = 0; i < num_partitions; i++) {
		partitions.emplace_back(CreatePartitionCollection(i));
		partitions.back()->SetPartitionIndex(i);
	}
}